

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O1

string * __thiscall
OpenMD::StringTokenizer::getRemainingString_abi_cxx11_
          (string *__return_storage_ptr__,StringTokenizer *this)

{
  char *pcVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  paVar3 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (this->currentPos_)._M_current;
  if ((this->end_)._M_current != pcVar1) {
    do {
      uVar2 = (long)paVar3 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
      std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,uVar2,0,'\x01');
      pcVar1 = pcVar1 + 1;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((__return_storage_ptr__->_M_dataplus)._M_p + uVar2 + 1);
    } while (pcVar1 != (this->end_)._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringTokenizer::getRemainingString() const {
    std::string result;
    std::string::const_iterator tmpIter = currentPos_;
    if (tmpIter != end_) {
      std::insert_iterator<std::string> insertIter(result, result.begin());

      while (tmpIter != end_) {
        *insertIter++ = *tmpIter++;
      }
    }

    return result;
  }